

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# registry_test.cc
# Opt level: O2

void __thiscall
prometheus::anon_unknown_0::RegistryTest_throw_for_same_family_name_Test::TestBody
          (RegistryTest_throw_for_same_family_name_Test *this)

{
  bool bVar1;
  Builder<prometheus::Counter> *pBVar2;
  AssertHelper local_170;
  undefined8 local_168;
  undefined1 local_160 [16];
  Builder<prometheus::Counter> local_150;
  string same_name;
  Registry registry;
  
  std::__cxx11::string::string((string *)&same_name,"same_name",(allocator *)&registry);
  Registry::Registry(&registry,Throw);
  local_170.data_ = (AssertHelperData *)local_160;
  local_160._0_8_ = 0;
  local_160._8_8_ = 0;
  local_168 = 0;
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    BuildCounter();
    pBVar2 = detail::Builder<prometheus::Counter>::Name(&local_150,&same_name);
    detail::Builder<prometheus::Counter>::Register(pBVar2,&registry);
    detail::Builder<prometheus::Counter>::~Builder(&local_150);
  }
  std::__cxx11::string::~string((string *)&local_170);
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      BuildCounter();
      pBVar2 = detail::Builder<prometheus::Counter>::Name(&local_150,&same_name);
      detail::Builder<prometheus::Counter>::Register(pBVar2,&registry);
      detail::Builder<prometheus::Counter>::~Builder(&local_150);
    }
  }
  testing::Message::Message((Message *)&local_150);
  testing::internal::AssertHelper::AssertHelper
            (&local_170,kNonFatalFailure,
             "/workspace/llm4binary/github/license_c_cmakelists/jupp0r[P]prometheus-cpp/core/tests/registry_test.cc"
             ,0x77,
             "Expected: BuildCounter().Name(same_name).Register(registry) throws an exception.\n  Actual: it doesn\'t."
            );
  testing::internal::AssertHelper::operator=(&local_170,(Message *)&local_150);
  testing::internal::AssertHelper::~AssertHelper(&local_170);
  if ((long *)local_150.labels_._M_t._M_impl._0_8_ != (long *)0x0) {
    (**(code **)(*(long *)local_150.labels_._M_t._M_impl._0_8_ + 8))();
  }
  Registry::~Registry(&registry);
  std::__cxx11::string::~string((string *)&same_name);
  return;
}

Assistant:

TEST(RegistryTest, throw_for_same_family_name) {
  const auto same_name = std::string{"same_name"};
  Registry registry{Registry::InsertBehavior::Throw};

  EXPECT_NO_THROW(BuildCounter().Name(same_name).Register(registry));
  EXPECT_ANY_THROW(BuildCounter().Name(same_name).Register(registry));
}